

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resample.cpp
# Opt level: O3

void Timidity::pre_resample(Renderer *song,Sample *sp)

{
  float *pfVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  short sVar4;
  float *pfVar5;
  ulong uVar6;
  float fVar7;
  uint uVar8;
  float *pfVar9;
  float *pfVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  float fVar16;
  float fVar17;
  double dVar18;
  float fVar19;
  float fVar20;
  ulong uVar10;
  
  if (sp->scale_factor == 0) {
    pfVar5 = sp->data;
    sVar4 = sp->scale_note;
    cmsg(0,2," * pre-resampling for note %d (%s%d)\n",(ulong)(uint)(int)sVar4,
         pre_resample::note_name +
         (short)(sVar4 + (((ushort)(sVar4 / 6 + (sVar4 >> 0xf)) >> 1) - (sVar4 >> 0xf)) * -0xc),
         (ulong)(((int)sVar4 & 0x7cU) / 0xc));
    iVar15 = sp->sample_rate;
    dVar18 = exp2((double)(int)sp->scale_note * 0.08333333333333333);
    fVar16 = ((float)(dVar18 * 8175.798947309669) * (float)iVar15) / (song->rate * sp->root_freq);
    if ((0.0 < fVar16) && (uVar12 = (uint)((float)sp->data_length / fVar16), -1 < (int)uVar12)) {
      uVar14 = uVar12 >> 0xc;
      pfVar9 = (float *)safe_malloc((ulong)(uVar14 * 4));
      uVar6 = (long)(sp->data_length + -0x1000) / (long)(int)uVar14;
      uVar10 = uVar6 & 0xffffffff;
      uVar8 = (uint)uVar6;
      iVar15 = -1;
      pfVar11 = pfVar9;
      uVar13 = uVar8;
      if (uVar14 == 1) goto LAB_00357546;
      *pfVar9 = *pfVar5;
      iVar15 = uVar14 - 2;
      uVar14 = uVar8;
      while( true ) {
        pfVar11 = pfVar11 + 1;
        uVar13 = (uint)uVar10;
        if (iVar15 == 0) break;
LAB_00357546:
        pfVar1 = pfVar5 + ((int)uVar13 >> 0xc);
        fVar17 = pfVar1[(ulong)(uVar13 < 0x1000) - 1];
        fVar7 = (float)(uVar13 & 0xfff) * 0.00024414062;
        fVar19 = (float)*(undefined8 *)pfVar1;
        fVar20 = (float)((ulong)*(undefined8 *)pfVar1 >> 0x20);
        *pfVar11 = ((((fVar19 - fVar20) * 3.0 + (pfVar1[2] - fVar17)) * fVar7 +
                    ((fVar17 - (fVar19 + fVar19)) + fVar20) * 3.0) * fVar7 +
                   ((fVar20 * 6.0 + (fVar19 * -3.0 - (fVar17 + fVar17))) - pfVar1[2])) *
                   fVar7 * 0.16666667 + fVar19;
        uVar14 = uVar13 + uVar8;
        uVar10 = (ulong)uVar14;
        iVar15 = iVar15 + -1;
      }
      fVar17 = pfVar5[(int)uVar14 >> 0xc];
      if ((uVar14 & 0xfff) != 0) {
        fVar17 = fVar17 + (float)(uVar14 & 0xfff) * 0.00024414062 *
                          (pfVar5[(long)((int)uVar14 >> 0xc) + 1] - fVar17);
      }
      *pfVar11 = fVar17;
      sp->data_length = uVar12;
      uVar2 = sp->loop_start;
      uVar3 = sp->loop_end;
      sp->loop_start = (int)((1.0 / fVar16) * (float)(int)uVar2);
      sp->loop_end = (int)((1.0 / fVar16) * (float)(int)uVar3);
      free(sp->data);
      sp->data = pfVar9;
      sp->sample_rate = 0;
    }
    return;
  }
  return;
}

Assistant:

void pre_resample(Renderer *song, Sample *sp)
{
	double a, xdiff;
	int incr, ofs, newlen, count;
	sample_t *newdata, *dest, *src = sp->data;
	sample_t v1, v2, v3, v4, *vptr;
	static const char note_name[12][3] =
	{
		"C", "C#", "D", "D#", "E", "F", "F#", "G", "G#", "A", "A#", "B"
	};

	if (sp->scale_factor != 0)
		return;

	cmsg(CMSG_INFO, VERB_NOISY, " * pre-resampling for note %d (%s%d)\n",
		sp->scale_note,
		note_name[sp->scale_note % 12], (sp->scale_note & 0x7F) / 12);

	a = (sp->sample_rate * note_to_freq(sp->scale_note)) / (sp->root_freq * song->rate);
	if (a <= 0)
		return;
	newlen = (int)(sp->data_length / a);
	if (newlen < 0 || (newlen >> FRACTION_BITS) > MAX_SAMPLE_SIZE)
		return;

	count = newlen >> FRACTION_BITS;
	dest = newdata = (sample_t *)safe_malloc(count * sizeof(float));

	ofs = incr = (sp->data_length - (1 << FRACTION_BITS)) / count;

	if (--count)
		*dest++ = src[0];

	/* Since we're pre-processing and this doesn't have to be done in
	real-time, we go ahead and do the full sliding cubic interpolation. */
	while (--count)
	{
		vptr = src + (ofs >> FRACTION_BITS);
		v1 = (vptr == src) ? *vptr : *(vptr - 1);
		v2 = *vptr;
		v3 = *(vptr + 1);
		v4 = *(vptr + 2);
		xdiff = FSCALENEG(ofs & FRACTION_MASK, FRACTION_BITS);
		*dest++ = sample_t(v2 + (xdiff / 6.0) * (-2 * v1 - 3 * v2 + 6 * v3 - v4 +
			xdiff * (3 * (v1 - 2 * v2 + v3) + xdiff * (-v1 + 3 * (v2 - v3) + v4))));
		ofs += incr;
	}

	if (ofs & FRACTION_MASK)
	{
		RESAMPLATION
	}
	else
	{
		*dest++ = src[ofs >> FRACTION_BITS];
	}

	sp->data_length = newlen;
	sp->loop_start = int(sp->loop_start / a);
	sp->loop_end = int(sp->loop_end / a);
	free(sp->data);
	sp->data = newdata;
	sp->sample_rate = 0;
}